

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O0

void __thiscall Clasp::SharedContext::setConcurrency(SharedContext *this,uint32 n,ResizeMode mode)

{
  Solver *pSVar1;
  size_type sVar2;
  reference ppSVar3;
  uint in_EDX;
  uint in_ESI;
  SharedContext *in_RDI;
  bool bVar4;
  bool bVar5;
  pod_vector<Clasp::Solver_*,_std::allocator<Clasp::Solver_*>_> *unaff_retaddr;
  SharedContext *in_stack_00000010;
  undefined6 in_stack_ffffffffffffffe0;
  undefined1 uVar6;
  undefined1 uVar7;
  
  if (in_ESI < 2) {
    in_RDI->share_ = (Share)((uint)in_RDI->share_ & 0xfffffc00 | 1);
  }
  else {
    in_RDI->share_ = (Share)((uint)in_RDI->share_ & 0xfffffc00 | in_ESI & 0x3ff);
    bk_lib::pod_vector<Clasp::Solver_*,_std::allocator<Clasp::Solver_*>_>::reserve
              (unaff_retaddr,(size_type)((ulong)in_RDI >> 0x20));
  }
  while( true ) {
    sVar2 = bk_lib::pod_vector<Clasp::Solver_*,_std::allocator<Clasp::Solver_*>_>::size
                      (&in_RDI->solvers_);
    bVar4 = sVar2 < ((uint)in_RDI->share_ & 0x3ff);
    bVar5 = (in_EDX & 1) != 0;
    uVar7 = bVar4 && bVar5;
    if (!bVar4 || !bVar5) break;
    pushSolver(in_stack_00000010);
  }
  while( true ) {
    sVar2 = bk_lib::pod_vector<Clasp::Solver_*,_std::allocator<Clasp::Solver_*>_>::size
                      (&in_RDI->solvers_);
    bVar4 = ((uint)in_RDI->share_ & 0x3ff) < sVar2;
    bVar5 = (in_EDX & 2) != 0;
    uVar6 = bVar4 && bVar5;
    if (!bVar4 || !bVar5) break;
    ppSVar3 = bk_lib::pod_vector<Clasp::Solver_*,_std::allocator<Clasp::Solver_*>_>::back
                        (&in_RDI->solvers_);
    pSVar1 = *ppSVar3;
    if (pSVar1 != (Solver *)0x0) {
      Solver::~Solver((Solver *)CONCAT17(uVar7,CONCAT16(uVar6,in_stack_ffffffffffffffe0)));
      operator_delete(pSVar1);
    }
    bk_lib::pod_vector<Clasp::Solver_*,_std::allocator<Clasp::Solver_*>_>::pop_back
              (&in_RDI->solvers_);
  }
  if (((uint)in_RDI->share_ >> 0x14 & 4) != 0) {
    setShareMode(in_RDI,share_auto);
  }
  return;
}

Assistant:

void SharedContext::setConcurrency(uint32 n, ResizeMode mode) {
	if (n <= 1) { share_.count = 1; }
	else        { share_.count = n; solvers_.reserve(n); }
	while (solvers_.size() < share_.count && (mode & resize_push) != 0u) {
		pushSolver();
	}
	while (solvers_.size() > share_.count && (mode & resize_pop) != 0u) {
		delete solvers_.back();
		solvers_.pop_back();
	}
	if ((share_.shareM & ContextParams::share_auto) != 0) {
		setShareMode(ContextParams::share_auto);
	}
}